

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O3

void __thiscall QLabelPrivate::movieUpdated(QLabelPrivate *this,QRect *rect)

{
  int iVar1;
  Data *pDVar2;
  QWidget *this_00;
  Representation RVar3;
  Representation RVar4;
  char cVar5;
  QStyle *pQVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  QRect QVar11;
  QRect local_70;
  QPixmap local_60 [24];
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = (this->movie).wp.d;
  if ((pDVar2 != (Data *)0x0) &&
     (this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8,
     (this->movie).wp.value != (QObject *)0x0 && *(int *)(pDVar2 + 4) != 0)) {
    cVar5 = QMovie::isValid();
    if (cVar5 != '\0') {
      local_48.x1.m_i = 0;
      local_48.y1.m_i = 0;
      local_48.x2.m_i = -1;
      local_48.y2.m_i = -1;
      if ((this->field_0x340 & 2) == 0) {
        pQVar6 = QWidget::style(this_00);
        local_70 = QWidget::contentsRect(this_00);
        iVar8 = this->align;
        QMovie::currentPixmap();
        auVar10 = (**(code **)(*(long *)pQVar6 + 0x90))(pQVar6,&local_70,iVar8,local_60);
        QPixmap::~QPixmap(local_60);
        iVar8 = (rect->x1).m_i;
        iVar1 = (rect->y1).m_i;
        local_48.x1.m_i = iVar8 + auVar10._0_4_;
        local_48.y1.m_i = iVar1 + auVar10._4_4_;
        iVar9 = (auVar10._8_4_ - auVar10._0_4_) + 1;
        iVar8 = ((rect->x2).m_i - iVar8) + 1;
        if (iVar9 < iVar8) {
          iVar8 = iVar9;
        }
        local_48.x2.m_i = iVar8 + local_48.x1.m_i + -1;
        iVar9 = (auVar10._12_4_ - auVar10._4_4_) + 1;
        iVar8 = ((rect->y2).m_i - iVar1) + 1;
        if (iVar9 < iVar8) {
          iVar8 = iVar9;
        }
        local_48.y2.m_i = iVar8 + local_48.y1.m_i + -1;
      }
      else {
        QVar11 = QWidget::contentsRect(this_00);
        QMovie::currentPixmap();
        uVar7 = QPixmap::size();
        RVar3 = QVar11.x1.m_i;
        QPixmap::~QPixmap(local_60);
        if (((int)uVar7 + RVar3.m_i + -1 < RVar3.m_i) ||
           (RVar4 = QVar11.y1.m_i, iVar8 = (int)((ulong)uVar7 >> 0x20),
           RVar4.m_i + iVar8 + -1 < RVar4.m_i)) goto LAB_00411cb0;
        local_48._0_8_ = QVar11._0_8_;
        local_48.x2.m_i =
             (((QVar11.x2.m_i.m_i - RVar3.m_i) + 1) * (((rect->x2).m_i - (rect->x1).m_i) + 1)) /
             (int)uVar7 + RVar3.m_i + -1;
        local_48.y2.m_i =
             (((QVar11.y2.m_i.m_i - RVar4.m_i) + 1) * (((rect->y2).m_i - (rect->y1).m_i) + 1)) /
             iVar8 + RVar4.m_i + -1;
      }
      QWidget::update(this_00,&local_48);
    }
  }
LAB_00411cb0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLabelPrivate::movieUpdated(const QRect &rect)
{
    Q_Q(QLabel);
    if (movie && movie->isValid()) {
        QRect r;
        if (scaledcontents) {
            QRect cr = q->contentsRect();
            QRect pixmapRect(cr.topLeft(), movie->currentPixmap().size());
            if (pixmapRect.isEmpty())
                return;
            r.setRect(cr.left(), cr.top(),
                      (rect.width() * cr.width()) / pixmapRect.width(),
                      (rect.height() * cr.height()) / pixmapRect.height());
        } else {
            r = q->style()->itemPixmapRect(q->contentsRect(), align, movie->currentPixmap());
            r.translate(rect.x(), rect.y());
            r.setWidth(qMin(r.width(), rect.width()));
            r.setHeight(qMin(r.height(), rect.height()));
        }
        q->update(r);
    }
}